

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxlpbase.h
# Opt level: O1

void __thiscall
soplex::
SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::changeElement(SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,int i,int j,
               number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *val,bool scale)

{
  uint *puVar1;
  uint uVar2;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar3;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar4;
  Real a;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  Item *this_02;
  int iVar12;
  int *piVar13;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  char *pcVar17;
  undefined7 in_register_00000081;
  Item *this_03;
  bool bVar18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  uint local_194;
  uint local_190;
  undefined4 local_18c;
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  uint local_158 [3];
  undefined3 uStack_14b;
  int iStack_148;
  bool bStack_144;
  undefined8 local_140;
  Item *local_130;
  cpp_dec_float<100U,_int,_void> local_128;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8 [2];
  uint auStack_c0 [2];
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8 [2];
  uint auStack_a0 [2];
  uint local_98 [2];
  uint auStack_90 [2];
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  int local_48;
  undefined1 local_44;
  undefined8 local_40;
  
  if ((j | i) < 0) {
    return;
  }
  local_18c = (undefined4)CONCAT71(in_register_00000081,scale);
  this_03 = (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  local_130 = (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.theitem +
              (this->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thekey[j].idx;
  local_c8 = *(uint (*) [2])(val->m_backend).data._M_elems;
  auStack_c0 = *(uint (*) [2])((val->m_backend).data._M_elems + 2);
  local_b8 = *(uint (*) [2])((val->m_backend).data._M_elems + 4);
  auStack_b0 = *(uint (*) [2])((val->m_backend).data._M_elems + 6);
  local_a8 = *(uint (*) [2])((val->m_backend).data._M_elems + 8);
  auStack_a0 = *(uint (*) [2])((val->m_backend).data._M_elems + 10);
  local_98 = *(uint (*) [2])((val->m_backend).data._M_elems + 0xc);
  auStack_90 = *(uint (*) [2])((val->m_backend).data._M_elems + 0xe);
  iVar12 = (val->m_backend).exp;
  bVar18 = (val->m_backend).neg;
  local_d8._0_4_ = (val->m_backend).fpclass;
  local_d8._4_4_ = (val->m_backend).prec_elem;
  uStack_d0 = 0;
  this_00 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  this_01 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_194 = i;
  local_190 = j;
  a = Tolerances::epsilon(this_00);
  local_128.data._M_elems[0xc] = local_98[0];
  local_128.data._M_elems[0xd] = local_98[1];
  local_128.data._M_elems[0xe] = auStack_90[0];
  local_128.data._M_elems[0xf] = auStack_90[1];
  local_128.data._M_elems[8] = local_a8[0];
  local_128.data._M_elems[9] = local_a8[1];
  local_128.data._M_elems[10] = auStack_a0[0];
  local_128.data._M_elems[0xb] = auStack_a0[1];
  local_128.data._M_elems[4] = local_b8[0];
  local_128.data._M_elems[5] = local_b8[1];
  local_128.data._M_elems[6] = auStack_b0[0];
  local_128.data._M_elems[7] = auStack_b0[1];
  local_128.data._M_elems[0] = local_c8[0];
  local_128.data._M_elems[1] = local_c8[1];
  uVar5 = local_128.data._M_elems._0_8_;
  local_128.data._M_elems[2] = auStack_c0[0];
  local_128.data._M_elems[3] = auStack_c0[1];
  local_128.exp = iVar12;
  local_128.neg = bVar18;
  local_128.fpclass = (fpclass_type)local_d8;
  local_128.prec_elem = local_d8._4_4_;
  if ((bVar18 != false) &&
     (local_128.data._M_elems[0] = local_c8[0],
     local_128.data._M_elems[0] != 0 || (fpclass_type)local_d8 != cpp_dec_float_finite)) {
    local_128.neg = (bool)(bVar18 ^ 1);
  }
  bVar18 = false;
  local_128.data._M_elems._0_8_ = uVar5;
  if (((fpclass_type)local_d8 != cpp_dec_float_NaN) && (!NAN(a))) {
    local_140._0_4_ = cpp_dec_float_finite;
    local_140._4_4_ = 0x10;
    local_188 = (undefined1  [16])0x0;
    local_178 = (undefined1  [16])0x0;
    local_168 = (undefined1  [16])0x0;
    local_158[0] = 0;
    local_158[1] = 0;
    stack0xfffffffffffffeb0 = 0;
    uStack_14b = 0;
    iStack_148 = 0;
    bStack_144 = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)local_188,a);
    iVar12 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                       (&local_128,(cpp_dec_float<100U,_int,_void> *)local_188);
    bVar18 = 0 < iVar12;
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  this_02 = local_130;
  if (!bVar18) {
    pNVar3 = (this_03->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if ((pNVar3 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) ||
       (uVar16 = (ulong)(this_03->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused, (long)uVar16 < 1)) {
LAB_003ad534:
      iVar12 = -1;
    }
    else {
      if (pNVar3->idx == local_190) {
        bVar18 = true;
        uVar14 = 0;
      }
      else {
        uVar14 = 0;
        piVar13 = &pNVar3[1].idx;
        do {
          if (uVar16 - 1 == uVar14) goto LAB_003ad534;
          uVar14 = uVar14 + 1;
          uVar2 = *piVar13;
          piVar13 = piVar13 + 0x15;
        } while (uVar2 != local_190);
        bVar18 = uVar14 < uVar16;
      }
      iVar12 = (int)uVar14;
      if (!bVar18) goto LAB_003ad534;
    }
    if (iVar12 < 0) {
      return;
    }
    pNVar4 = (local_130->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) ||
       (uVar16 = (ulong)(local_130->data).
                        super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        .memused, (long)uVar16 < 1)) {
LAB_003ad644:
      iVar12 = -1;
    }
    else {
      if (pNVar4->idx == local_194) {
        bVar18 = true;
        uVar14 = 0;
      }
      else {
        uVar14 = 0;
        piVar13 = &pNVar4[1].idx;
        do {
          if (uVar16 - 1 == uVar14) goto LAB_003ad644;
          uVar14 = uVar14 + 1;
          uVar2 = *piVar13;
          piVar13 = piVar13 + 0x15;
        } while (uVar2 != local_194);
        bVar18 = uVar14 < uVar16;
      }
      iVar12 = (int)uVar14;
      if (!bVar18) goto LAB_003ad644;
    }
    if (iVar12 < 0) {
      return;
    }
    if ((pNVar3 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) ||
       (pcVar15 = (char *)(long)(this_03->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused, (long)pcVar15 < 1)) {
LAB_003ad748:
      pcVar17 = (char *)0xffffffff;
    }
    else {
      if (pNVar3->idx == local_190) {
        bVar18 = true;
        pcVar17 = (char *)0x0;
      }
      else {
        pcVar17 = (char *)0x0;
        piVar13 = &pNVar3[1].idx;
        do {
          if (pcVar15 + -1 == pcVar17) goto LAB_003ad748;
          pcVar17 = pcVar17 + 1;
          uVar2 = *piVar13;
          piVar13 = piVar13 + 0x15;
        } while (uVar2 != local_190);
        bVar18 = pcVar17 < pcVar15;
      }
      if (!bVar18) goto LAB_003ad748;
    }
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_03,pcVar17);
    pNVar3 = (this_02->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)0x0) &&
       (pcVar15 = (char *)(long)(this_02->data).
                                super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                .memused, 0 < (long)pcVar15)) {
      if (pNVar3->idx == local_194) {
        bVar18 = true;
        pcVar17 = (char *)0x0;
      }
      else {
        pcVar17 = (char *)0x0;
        piVar13 = &pNVar3[1].idx;
        do {
          if (pcVar15 + -1 == pcVar17) goto LAB_003ad82d;
          pcVar17 = pcVar17 + 1;
          uVar2 = *piVar13;
          piVar13 = piVar13 + 0x15;
        } while (uVar2 != local_194);
        bVar18 = pcVar17 < pcVar15;
      }
      if (bVar18) goto LAB_003ad832;
    }
LAB_003ad82d:
    pcVar17 = (char *)0xffffffff;
LAB_003ad832:
    SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this_02,pcVar17);
    return;
  }
  local_140._0_4_ = cpp_dec_float_finite;
  local_140._4_4_ = 0x10;
  local_188 = ZEXT816(0);
  local_178 = ZEXT816(0);
  local_168 = ZEXT816(0);
  local_158[0] = 0;
  local_158[1] = 0;
  stack0xfffffffffffffeb0 = 0;
  uStack_14b = 0;
  iStack_148 = 0;
  bStack_144 = false;
  if ((char)local_18c != '\0') {
    local_88 = (val->m_backend).data._M_elems[0];
    uStack_84 = (val->m_backend).data._M_elems[1];
    uStack_80 = (val->m_backend).data._M_elems[2];
    uStack_7c = (val->m_backend).data._M_elems[3];
    local_78 = *(undefined8 *)((val->m_backend).data._M_elems + 4);
    uStack_70 = *(undefined8 *)((val->m_backend).data._M_elems + 6);
    local_68 = (val->m_backend).data._M_elems[8];
    uStack_64 = (val->m_backend).data._M_elems[9];
    uStack_60 = (val->m_backend).data._M_elems[10];
    uStack_5c = (val->m_backend).data._M_elems[0xb];
    local_58 = (val->m_backend).data._M_elems[0xc];
    uStack_54 = (val->m_backend).data._M_elems[0xd];
    uStack_50 = (val->m_backend).data._M_elems[0xe];
    uStack_4c = (val->m_backend).data._M_elems[0xf];
    local_48 = (val->m_backend).exp;
    local_44 = (val->m_backend).neg;
    local_40._0_4_ = (val->m_backend).fpclass;
    local_40._4_4_ = (val->m_backend).prec_elem;
    val = (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_128;
    (*this->lp_scaler->_vptr_SPxScaler[0x2a])
              (val,this->lp_scaler,this,(ulong)local_194,(ulong)local_190);
  }
  uVar5 = *(undefined8 *)(((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->data)._M_elems
  ;
  uVar6 = *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 2);
  local_188 = *(undefined1 (*) [16])
               (((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->data)._M_elems;
  puVar1 = (((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 4;
  uVar7 = *(undefined8 *)puVar1;
  uVar8 = *(undefined8 *)
           ((((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 6);
  local_178 = *(undefined1 (*) [16])puVar1;
  puVar1 = (((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 8;
  uVar9 = *(undefined8 *)puVar1;
  uVar10 = *(undefined8 *)
            ((((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 10);
  local_168 = *(undefined1 (*) [16])puVar1;
  local_158._0_8_ =
       *(undefined8 *)
        ((((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 0xc);
  uVar11 = *(undefined8 *)
            ((((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->data)._M_elems + 0xe);
  stack0xfffffffffffffeb0 = (undefined5)uVar11;
  uStack_14b = (undefined3)((ulong)uVar11 >> 0x28);
  iStack_148 = ((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->exp;
  bStack_144 = ((cpp_dec_float<100U,_int,_void> *)&(val->m_backend).data)->neg;
  local_140._0_4_ = (val->m_backend).fpclass;
  local_140._4_4_ = (val->m_backend).prec_elem;
  pNVar3 = (this_03->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar3 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) ||
     (uVar16 = (ulong)(this_03->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, (long)uVar16 < 1)) {
LAB_003ad4cc:
    iVar12 = -1;
  }
  else {
    if (pNVar3->idx == local_190) {
      bVar18 = true;
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      piVar13 = &pNVar3[1].idx;
      do {
        if (uVar16 - 1 == uVar14) goto LAB_003ad4cc;
        uVar14 = uVar14 + 1;
        uVar2 = *piVar13;
        piVar13 = piVar13 + 0x15;
      } while (uVar2 != local_190);
      bVar18 = uVar14 < uVar16;
    }
    iVar12 = (int)uVar14;
    if (!bVar18) goto LAB_003ad4cc;
  }
  if (iVar12 < 0) goto LAB_003ad5d1;
  pNVar4 = (this_02->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar4 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) ||
     (uVar16 = (ulong)(this_02->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, (long)uVar16 < 1)) {
LAB_003ad5a0:
    iVar12 = -1;
  }
  else {
    if (pNVar4->idx == local_194) {
      bVar18 = true;
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      piVar13 = &pNVar4[1].idx;
      do {
        if (uVar16 - 1 == uVar14) goto LAB_003ad5a0;
        uVar14 = uVar14 + 1;
        uVar2 = *piVar13;
        piVar13 = piVar13 + 0x15;
      } while (uVar2 != local_194);
      bVar18 = uVar14 < uVar16;
    }
    iVar12 = (int)uVar14;
    if (!bVar18) goto LAB_003ad5a0;
  }
  if (iVar12 < 0) {
LAB_003ad5d1:
    LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add2(&this->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,local_194,1,(int *)&local_190,
           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)local_188);
    LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add2(&this->
            super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ,local_190,1,(int *)&local_194,
           (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *)local_188);
    return;
  }
  if ((pNVar3 == (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) ||
     (uVar16 = (ulong)(this_03->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, (long)uVar16 < 1)) {
LAB_003ad6a4:
    iVar12 = -1;
  }
  else {
    if (pNVar3->idx == local_190) {
      bVar18 = true;
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      piVar13 = &pNVar3[1].idx;
      do {
        if (uVar16 - 1 == uVar14) goto LAB_003ad6a4;
        uVar14 = uVar14 + 1;
        uVar2 = *piVar13;
        piVar13 = piVar13 + 0x15;
      } while (uVar2 != local_190);
      bVar18 = uVar14 < uVar16;
    }
    iVar12 = (int)uVar14;
    if (!bVar18) goto LAB_003ad6a4;
  }
  puVar1 = pNVar3[iVar12].val.m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = local_158._0_8_;
  *(undefined8 *)(puVar1 + 2) = uVar11;
  puVar1 = pNVar3[iVar12].val.m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = uVar9;
  *(undefined8 *)(puVar1 + 2) = uVar10;
  puVar1 = pNVar3[iVar12].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = uVar7;
  *(undefined8 *)(puVar1 + 2) = uVar8;
  *(undefined8 *)pNVar3[iVar12].val.m_backend.data._M_elems = uVar5;
  *(undefined8 *)(pNVar3[iVar12].val.m_backend.data._M_elems + 2) = uVar6;
  pNVar3[iVar12].val.m_backend.exp = iStack_148;
  pNVar3[iVar12].val.m_backend.neg = bStack_144;
  pNVar3[iVar12].val.m_backend.fpclass = (fpclass_type)local_140;
  pNVar3[iVar12].val.m_backend.prec_elem = local_140._4_4_;
  pNVar3 = (this_02->data).
           super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           .m_elem;
  if ((pNVar3 != (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)0x0) &&
     (uVar16 = (ulong)(this_02->data).
                      super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      .memused, 0 < (long)uVar16)) {
    if (pNVar3->idx == local_194) {
      bVar18 = true;
      uVar14 = 0;
    }
    else {
      uVar14 = 0;
      piVar13 = &pNVar3[1].idx;
      do {
        if (uVar16 - 1 == uVar14) goto LAB_003ad7af;
        uVar14 = uVar14 + 1;
        uVar2 = *piVar13;
        piVar13 = piVar13 + 0x15;
      } while (uVar2 != local_194);
      bVar18 = uVar14 < uVar16;
    }
    iVar12 = (int)uVar14;
    if (bVar18) goto LAB_003ad7b6;
  }
LAB_003ad7af:
  iVar12 = -1;
LAB_003ad7b6:
  puVar1 = pNVar3[iVar12].val.m_backend.data._M_elems + 0xc;
  *(undefined8 *)puVar1 = local_158._0_8_;
  *(undefined8 *)(puVar1 + 2) = uVar11;
  puVar1 = pNVar3[iVar12].val.m_backend.data._M_elems + 8;
  *(undefined8 *)puVar1 = uVar9;
  *(undefined8 *)(puVar1 + 2) = uVar10;
  puVar1 = pNVar3[iVar12].val.m_backend.data._M_elems + 4;
  *(undefined8 *)puVar1 = uVar7;
  *(undefined8 *)(puVar1 + 2) = uVar8;
  *(undefined8 *)pNVar3[iVar12].val.m_backend.data._M_elems = uVar5;
  *(undefined8 *)(pNVar3[iVar12].val.m_backend.data._M_elems + 2) = uVar6;
  pNVar3[iVar12].val.m_backend.exp = iStack_148;
  pNVar3[iVar12].val.m_backend.neg = bStack_144;
  pNVar3[iVar12].val.m_backend.fpclass = (fpclass_type)local_140;
  pNVar3[iVar12].val.m_backend.prec_elem = local_140._4_4_;
  return;
}

Assistant:

virtual void changeElement(int i, int j, const R& val, bool scale = false)
   {
      if(i < 0 || j < 0)
         return;

      SVectorBase<R>& row = rowVector_w(i);
      SVectorBase<R>& col = colVector_w(j);

      if(isNotZero(val, this->tolerances()->epsilon()))
      {
         R newVal;

         if(scale)
         {
            assert(_isScaled);
            assert(lp_scaler);
            newVal = lp_scaler->scaleElement(*this, i, j, val);
         }
         else
            newVal = val;

         if(row.pos(j) >= 0 && col.pos(i) >= 0)
         {
            row.value(row.pos(j)) = newVal;
            col.value(col.pos(i)) = newVal;
         }
         else
         {
            LPRowSetBase<R>::add2(i, 1, &j, &newVal);
            LPColSetBase<R>::add2(j, 1, &i, &newVal);
         }
      }
      else if(row.pos(j) >= 0 && col.pos(i) >= 0)
      {
         row.remove(row.pos(j));
         col.remove(col.pos(i));
      }

      assert(isConsistent());
   }